

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixture_unittests.cc
# Opt level: O2

pair<const_char_*const,_ValueType>
UniqueObjectHelper<std::pair<char_const*const,ValueType>>(int index)

{
  char *pcVar1;
  ValueType extraout_RDX;
  int in_ESI;
  undefined4 in_register_0000003c;
  char *pcVar2;
  pair<const_char_*const,_ValueType> pVar3;
  ValueType VStack_28;
  
  pcVar2 = (char *)CONCAT44(in_register_0000003c,index);
  pcVar1 = UniqueObjectHelper<char*>(in_ESI);
  UniqueObjectHelper<ValueType>((int)&VStack_28);
  *(char **)pcVar2 = pcVar1;
  ValueType::ValueType((ValueType *)(pcVar2 + 8),&VStack_28);
  ValueType::~ValueType(&VStack_28);
  pVar3.second.s_ = extraout_RDX.s_;
  pVar3.first = pcVar2;
  return pVar3;
}

Assistant:

pair<const char* const, ValueType> UniqueObjectHelper(int index) {
  return pair<const char* const, ValueType>(
      UniqueObjectHelper<char*>(index),
      UniqueObjectHelper<ValueType>(index + 1));
}